

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

potVec * __thiscall
OpenMD::Stats::getPotVecData(potVec *__return_storage_ptr__,Stats *this,int index)

{
  long lVar1;
  uint i;
  long lVar2;
  
  __return_storage_ptr__->data_[4] = 0.0;
  __return_storage_ptr__->data_[5] = 0.0;
  __return_storage_ptr__->data_[2] = 0.0;
  __return_storage_ptr__->data_[3] = 0.0;
  __return_storage_ptr__->data_[0] = 0.0;
  __return_storage_ptr__->data_[1] = 0.0;
  __return_storage_ptr__->data_[6] = 0.0;
  lVar1 = __dynamic_cast((this->data_).
                         super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                         ._M_impl.super__Vector_impl_data._M_start[index].accumulator,
                         &BaseAccumulator::typeinfo,&PotVecAccumulator::typeinfo);
  if ((potVec *)(lVar1 + 0x10) != __return_storage_ptr__) {
    lVar2 = 0;
    do {
      __return_storage_ptr__->data_[lVar2] = ((potVec *)(lVar1 + 0x10))->data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 7);
  }
  return __return_storage_ptr__;
}

Assistant:

potVec Stats::getPotVecData(int index) {
    assert(index >= 0 && index < ENDINDEX);
    potVec value;
    dynamic_cast<PotVecAccumulator*>(data_[index].accumulator)
        ->getLastValue(value);
    return value;
  }